

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O1

void anon_unknown.dwarf_5ea27a::convert_timeseries_option
               (Options *opts,char *ts_opt_name,string *target)

{
  bool bVar1;
  string spot_opt_name;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"timeseries.","");
  std::__cxx11::string::append((char *)local_68);
  bVar1 = cali::ConfigManager::Options::is_set(opts,(char *)local_68[0]);
  if (bVar1) {
    if (target->_M_string_length != 0) {
      std::__cxx11::string::append((char *)target);
    }
    std::__cxx11::string::append((char *)target);
    std::__cxx11::string::append((char *)target);
    cali::ConfigManager::Options::get_abi_cxx11_(&local_48,opts,(char *)local_68[0],"");
    std::__cxx11::string::_M_append((char *)target,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void convert_timeseries_option(const ConfigManager::Options& opts, const char* ts_opt_name, std::string& target)
{
    std::string spot_opt_name = "timeseries.";
    spot_opt_name.append(ts_opt_name);

    if (opts.is_set(spot_opt_name.c_str())) {
        if (!target.empty())
            target.append(",");

        target.append(ts_opt_name);
        target.append("=");
        target.append(opts.get(spot_opt_name.c_str()));
    }
}